

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O0

String * __thiscall MathML::AST::ConstantExpression::toString_abi_cxx11_(ConstantExpression *this)

{
  int iVar1;
  long lVar2;
  long in_RSI;
  String *in_RDI;
  stringstream ss;
  string *local_1d0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  lVar2 = std::__cxx11::string::size();
  if ((lVar2 == 0) || (*(int *)(in_RSI + 8) != 0)) {
    iVar1 = *(int *)(in_RSI + 8);
    if (iVar1 == 1) {
      if ((*(double *)(in_RSI + 0x10) != 0.0) || (NAN(*(double *)(in_RSI + 0x10)))) {
        local_1d0 = (string *)SCALAR_TRUE_VALUE_abi_cxx11_;
      }
      else {
        local_1d0 = (string *)SCALAR_FALSE_VALUE_abi_cxx11_;
      }
      std::__cxx11::string::string((string *)in_RDI,local_1d0);
    }
    else if (iVar1 == 2) {
      std::ostream::operator<<(local_188,(long)*(double *)(in_RSI + 0x10));
      std::__cxx11::stringstream::str();
    }
    else if (iVar1 == 3) {
      std::ostream::operator<<(local_188,*(double *)(in_RSI + 0x10));
      std::__cxx11::stringstream::str();
    }
    else {
      std::__cxx11::string::string((string *)in_RDI,(string *)SCALAR_INVALID_VALUE_abi_cxx11_);
    }
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x18));
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

MathML::String ConstantExpression::toString() const
        {
            std::stringstream ss;

            if ( mStringValue.size() > 0 && mType == SCALAR_INVALID )
            {
                return mStringValue;
            }

            //check type
            switch ( mType )
            {

            case SCALAR_BOOL:
                return ( mValue == 0. ) ? SCALAR_FALSE_VALUE : SCALAR_TRUE_VALUE;

            case SCALAR_LONG:
                //return StringUtil::valueOf( static_cast<long>( mValue ) );
                ss << static_cast<long>( mValue );
                return ss.str();

            case SCALAR_DOUBLE:
                //return StringUtil::valueOf( mValue );
                ss << mValue;
                return ss.str();

            default:
                return SCALAR_INVALID_VALUE;
            }
        }